

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_mesh.c
# Opt level: O0

void build_bvh_tree(BVHNode *bvh_root,TriangleMesh *mesh,Centroid *centroids_by_x,
                   Centroid *centroids_by_y,Centroid *centroids_by_z,uint depth,
                   Triangle *new_triangles)

{
  float fVar1;
  size_t sVar2;
  float *pfVar3;
  long lVar4;
  size_t sVar5;
  size_t __ptr;
  Centroid *pCVar6;
  uint uVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  bool local_c1;
  BVHBuildStackNode *new_stack_element;
  size_t idx;
  size_t i_3;
  int triangles_seen;
  _Bool *r_indices;
  _Bool *l_indices;
  Centroid *pCStack_88;
  int split_axis;
  Centroid *centroids_by_split_axis;
  size_t i_2;
  ulong uStack_70;
  int j;
  size_t i_1;
  int triangle_count;
  _Bool *indices;
  BVHNode *node;
  BVHBuildStackNode *current;
  size_t i;
  BVHBuildStackNode *stack_head;
  uint depth_local;
  Centroid *centroids_by_z_local;
  Centroid *centroids_by_y_local;
  Centroid *centroids_by_x_local;
  TriangleMesh *mesh_local;
  BVHNode *bvh_root_local;
  
  i = (size_t)malloc(0x20);
  *(BVHNode **)i = bvh_root;
  *(undefined4 *)(i + 0x10) = 0;
  pvVar8 = malloc(mesh->triangle_count);
  *(void **)(i + 8) = pvVar8;
  *(undefined8 *)(i + 0x18) = 0;
  for (current = (BVHBuildStackNode *)0x0; current < (BVHBuildStackNode *)mesh->triangle_count;
      current = (BVHBuildStackNode *)((long)&current->bvh_node + 1)) {
    *(undefined1 *)((long)&current->bvh_node + *(long *)(i + 8)) = 1;
  }
  while (__ptr = i, i != 0) {
    sVar2 = *(size_t *)(i + 0x18);
    pfVar3 = *(float **)i;
    lVar4 = *(long *)(i + 8);
    *pfVar3 = INFINITY;
    pfVar3[1] = INFINITY;
    pfVar3[2] = INFINITY;
    pfVar3[3] = -INFINITY;
    pfVar3[4] = -INFINITY;
    pfVar3[5] = -INFINITY;
    i_1._4_4_ = 0;
    for (uStack_70 = 0; uStack_70 < mesh->triangle_count; uStack_70 = uStack_70 + 1) {
      if ((*(byte *)(lVar4 + uStack_70) & 1) != 0) {
        for (i_2._4_4_ = 0; i_2._4_4_ < 3; i_2._4_4_ = i_2._4_4_ + 1) {
          if (mesh->triangles[uStack_70].vertices[i_2._4_4_].x < *pfVar3) {
            *pfVar3 = mesh->triangles[uStack_70].vertices[i_2._4_4_].x;
          }
          fVar1 = mesh->triangles[uStack_70].vertices[i_2._4_4_].x;
          if (pfVar3[3] <= fVar1 && fVar1 != pfVar3[3]) {
            pfVar3[3] = mesh->triangles[uStack_70].vertices[i_2._4_4_].x;
          }
          if (mesh->triangles[uStack_70].vertices[i_2._4_4_].y < pfVar3[1]) {
            pfVar3[1] = mesh->triangles[uStack_70].vertices[i_2._4_4_].y;
          }
          fVar1 = mesh->triangles[uStack_70].vertices[i_2._4_4_].y;
          if (pfVar3[4] <= fVar1 && fVar1 != pfVar3[4]) {
            pfVar3[4] = mesh->triangles[uStack_70].vertices[i_2._4_4_].y;
          }
          if (mesh->triangles[uStack_70].vertices[i_2._4_4_].z < pfVar3[2]) {
            pfVar3[2] = mesh->triangles[uStack_70].vertices[i_2._4_4_].z;
          }
          fVar1 = mesh->triangles[uStack_70].vertices[i_2._4_4_].z;
          if (pfVar3[5] <= fVar1 && fVar1 != pfVar3[5]) {
            pfVar3[5] = mesh->triangles[uStack_70].vertices[i_2._4_4_].z;
          }
        }
        i_1._4_4_ = i_1._4_4_ + 1;
      }
    }
    local_c1 = i_1._4_4_ < 6 || 0x13 < depth;
    *(bool *)(pfVar3 + 6) = local_c1;
    if (((uint)pfVar3[6] & 1) == 0) {
      pCStack_88 = (Centroid *)0x0;
      uVar7 = *(uint *)(i + 0x10) % 3;
      pCVar6 = centroids_by_x;
      if (((uVar7 != 0) && (pCVar6 = centroids_by_y, uVar7 != 1)) &&
         (pCVar6 = centroids_by_z, uVar7 != 2)) {
        pCVar6 = pCStack_88;
      }
      pCStack_88 = pCVar6;
      pvVar8 = malloc(mesh->triangle_count);
      pvVar9 = malloc(mesh->triangle_count);
      i_3._4_4_ = 0;
      for (idx = 0; idx < mesh->triangle_count; idx = idx + 1) {
        sVar5 = pCStack_88[idx].idx;
        *(undefined1 *)((long)pvVar8 + sVar5) = 0;
        *(undefined1 *)((long)pvVar9 + sVar5) = 0;
        if ((*(byte *)(lVar4 + sVar5) & 1) != 0) {
          if (i_3._4_4_ < i_1._4_4_ / 2) {
            *(undefined1 *)((long)pvVar8 + sVar5) = 1;
          }
          else {
            *(undefined1 *)((long)pvVar9 + sVar5) = 1;
          }
          i_3._4_4_ = i_3._4_4_ + 1;
        }
      }
      pvVar10 = malloc(0x30);
      *(void **)(pfVar3 + 8) = pvVar10;
      pvVar10 = malloc(0x30);
      *(void **)(pfVar3 + 10) = pvVar10;
      puVar11 = (undefined8 *)malloc(0x20);
      *puVar11 = *(undefined8 *)(pfVar3 + 10);
      puVar11[1] = pvVar9;
      *(int *)(puVar11 + 2) = *(int *)(i + 0x10) + 1;
      puVar11[3] = sVar2;
      puVar12 = (undefined8 *)malloc(0x20);
      *puVar12 = *(undefined8 *)(pfVar3 + 8);
      puVar12[1] = pvVar8;
      *(int *)(puVar12 + 2) = *(int *)(i + 0x10) + 1;
      puVar12[3] = puVar11;
      i = (size_t)puVar12;
    }
    else {
      *(Triangle **)(pfVar3 + 8) = new_triangles;
      pfVar3[10] = 0.0;
      for (centroids_by_split_axis = (Centroid *)0x0;
          centroids_by_split_axis < (Centroid *)mesh->triangle_count;
          centroids_by_split_axis = (Centroid *)((long)&(centroids_by_split_axis->p).x + 1)) {
        if ((*(byte *)((long)&(centroids_by_split_axis->p).x + lVar4) & 1) != 0) {
          fVar1 = pfVar3[10];
          pfVar3[10] = (float)((int)fVar1 + 1);
          memcpy((void *)(*(long *)(pfVar3 + 8) + (long)(int)fVar1 * 0x48),
                 mesh->triangles + (long)centroids_by_split_axis,0x48);
        }
      }
      new_triangles = new_triangles + (int)pfVar3[10];
      i = sVar2;
    }
    free(*(void **)(__ptr + 8));
    free((void *)__ptr);
  }
  return;
}

Assistant:

void build_bvh_tree(BVHNode* bvh_root, TriangleMesh* mesh,
                    Centroid* centroids_by_x, Centroid* centroids_by_y, Centroid* centroids_by_z,
                    unsigned int depth, Triangle* new_triangles) {
    BVHBuildStackNode* stack_head = malloc(sizeof(BVHBuildStackNode));

    stack_head->bvh_node = bvh_root;
    stack_head->depth = 0;
    stack_head->indices = malloc(sizeof(bool) * mesh->triangle_count);
    stack_head->prev = NULL;

    for (size_t i = 0; i < mesh->triangle_count; i++) {
        stack_head->indices[i] = true;
    }

    while (stack_head) {
        // pop topmost node
        BVHBuildStackNode* current = stack_head;
        stack_head = stack_head->prev;

        BVHNode* node = current->bvh_node;
        bool* indices = current->indices;

        // compute bounding box for current node
        node->vmin.x = INFINITY;
        node->vmin.y = INFINITY;
        node->vmin.z = INFINITY;

        node->vmax.x = -INFINITY;
        node->vmax.y = -INFINITY;
        node->vmax.z = -INFINITY;
        
        int triangle_count = 0;

        for (size_t i = 0; i < mesh->triangle_count; i++) {
            if (indices[i]) {
                for (int j = 0; j < 3; j++) {
                    if (mesh->triangles[i].vertices[j].x < node->vmin.x) {
                        node->vmin.x = mesh->triangles[i].vertices[j].x;
                    }
                    if (mesh->triangles[i].vertices[j].x > node->vmax.x) {
                        node->vmax.x = mesh->triangles[i].vertices[j].x;
                    }

                    if (mesh->triangles[i].vertices[j].y < node->vmin.y) {
                        node->vmin.y = mesh->triangles[i].vertices[j].y;
                    }
                    if (mesh->triangles[i].vertices[j].y > node->vmax.y) {
                        node->vmax.y = mesh->triangles[i].vertices[j].y;
                    }

                    if (mesh->triangles[i].vertices[j].z < node->vmin.z) {
                        node->vmin.z = mesh->triangles[i].vertices[j].z;
                    }
                    if (mesh->triangles[i].vertices[j].z > node->vmax.z) {
                        node->vmax.z = mesh->triangles[i].vertices[j].z;
                    }
                }
                triangle_count++;
            }
        }
        
        node->isLeaf = (triangle_count <= 5 || depth >= 20);
        if (node->isLeaf) {
            // base case : store new triangles in the right place in the reordered triangle array
            node->data.triangles.array = new_triangles;
            node->data.triangles.count = 0;
            for (size_t i = 0; i < mesh->triangle_count; i++) {
                if (indices[i]) {
                    node->data.triangles.array[node->data.triangles.count++] = mesh->triangles[i];
                }
            }
            new_triangles += node->data.triangles.count;
        } else {
            Centroid* centroids_by_split_axis = NULL;
            int split_axis = current->depth % 3;
            switch (split_axis) {
            case 0:
                centroids_by_split_axis = centroids_by_x;
                break;
            case 1:
                centroids_by_split_axis = centroids_by_y;
                break;
            case 2:
                centroids_by_split_axis = centroids_by_z;
                break;
            }

            bool* l_indices = malloc(sizeof(bool) * mesh->triangle_count);
            bool* r_indices = malloc(sizeof(bool) * mesh->triangle_count);

            int triangles_seen = 0;
            for (size_t i = 0; i < mesh->triangle_count; i++) {
                size_t idx = centroids_by_split_axis[i].idx;
                l_indices[idx] = false;
                r_indices[idx] = false;
                if (indices[idx]) {
                    if (triangles_seen < triangle_count / 2) {
                        l_indices[idx] = true;
                    } else {
                        r_indices[idx] = true;
                    }
                    triangles_seen++;
                }
            }

            node->data.children.left = malloc(sizeof(BVHNode));
            node->data.children.right = malloc(sizeof(BVHNode));
            
            // push right child on stack
            BVHBuildStackNode* new_stack_element = malloc(sizeof(BVHBuildStackNode));
            new_stack_element->bvh_node = node->data.children.right;
            new_stack_element->indices = r_indices;
            new_stack_element->depth = current->depth + 1;
            
            new_stack_element->prev = stack_head;
            stack_head = new_stack_element;

            // push left child on stack
            new_stack_element = malloc(sizeof(BVHBuildStackNode));
            new_stack_element->bvh_node = node->data.children.left;
            new_stack_element->indices = l_indices;
            new_stack_element->depth = current->depth + 1;
            
            new_stack_element->prev = stack_head;
            stack_head = new_stack_element;
        }
        // cleanup
        free(current->indices);
        free(current);
    }
}